

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::AssertionInstanceExpression::fromLookup
          (Symbol *symbol,InvocationExpressionSyntax *syntax,SourceRange range,
          ASTContext *parentContext)

{
  bitmask<slang::ast::ASTFlags> flags;
  LookupLocation lookupLocation;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange sourceRange_06;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  string_view arg_09;
  string_view *psVar1;
  Symbol **__x;
  bool bVar2;
  int iVar5;
  reference ppAVar6;
  ulong uVar7;
  reference ppSVar8;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> _Var3;
  undefined1 uVar4;
  pointer ppVar9;
  equal_to<const_slang::ast::Symbol_*> *this;
  raw_key_type *__y;
  size_type sVar10;
  undefined4 extraout_var;
  undefined8 uVar11;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  SourceLocation extraout_RDX;
  long in_RSI;
  Symbol *in_RDI;
  undefined8 *in_R8;
  SourceRange SVar12;
  Token TVar13;
  string_view sVar14;
  AssertionInstanceExpression *result;
  AssertionExpr *body;
  SmallVector<const_slang::ast::Symbol_*,_5UL> localVars;
  SyntaxNode *bodySyntax;
  ASTContext bodyContext;
  Diagnostic *diag_3;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
  *pair;
  iterator __end2_1;
  iterator __begin2_1;
  NamedArgMap *__range2_1;
  Diagnostic *diag_2;
  ActualArg arg;
  Diagnostic *diag_1;
  iterator it_1;
  Diagnostic *diag;
  iterator it;
  SyntaxNode *arg_1;
  anon_class_48_6_f5681a60 setDefault;
  optional<slang::ast::ASTContext> defValCtx;
  PropertyExprSyntax *expr;
  ASTContext *argCtx;
  AssertionPortSymbol *formal;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *__range2;
  SmallVector<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_4UL>
  actualArgs;
  SourceLocation outputLocalVarArgLoc;
  uint32_t orderedIndex;
  bool bad;
  InvalidAssertionExpr *body_1;
  AssertionInstanceDetails *currInst;
  AssertionInstanceDetails instance;
  ASTContext context;
  NamedArgMap namedArgs;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> orderedArgs;
  LetDeclSymbol *let;
  PropertySymbol *prop;
  SequenceSymbol *seq;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> formalPorts;
  Scope *symbolScope;
  Type *type;
  Compilation *comp;
  size_t hash_1;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash_2;
  Symbol **k;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  Expression *in_stack_fffffffffffff0d8;
  undefined7 in_stack_fffffffffffff0e0;
  undefined1 in_stack_fffffffffffff0e7;
  SourceLocation in_stack_fffffffffffff0e8;
  undefined4 in_stack_fffffffffffff0f0;
  DiagCode in_stack_fffffffffffff0f4;
  SourceLocation in_stack_fffffffffffff0f8;
  ASTContext *this_00;
  undefined4 in_stack_fffffffffffff100;
  DiagCode in_stack_fffffffffffff104;
  SourceLocation SVar15;
  SourceLocation in_stack_fffffffffffff108;
  SourceLocation SVar16;
  Symbol *in_stack_fffffffffffff110;
  DiagCode DVar17;
  Type *in_stack_fffffffffffff118;
  Diagnostic *in_stack_fffffffffffff120;
  undefined4 in_stack_fffffffffffff128;
  SyntaxKind in_stack_fffffffffffff12c;
  Compilation *in_stack_fffffffffffff130;
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
  *in_stack_fffffffffffff150;
  Symbol **in_stack_fffffffffffff158;
  try_emplace_args_t *in_stack_fffffffffffff160;
  size_t in_stack_fffffffffffff168;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  *in_stack_fffffffffffff170;
  char *in_stack_fffffffffffff190;
  size_t in_stack_fffffffffffff198;
  Diagnostic *in_stack_fffffffffffff1a0;
  SourceLocation in_stack_fffffffffffff1a8;
  undefined7 in_stack_fffffffffffff1b0;
  SourceLocation in_stack_fffffffffffff1b8;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> local_e24;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> local_e22;
  NamedArgMap *in_stack_fffffffffffff228;
  undefined1 *puVar18;
  undefined1 *puVar19;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> *in_stack_fffffffffffff230;
  ArgumentListSyntax *in_stack_fffffffffffff238;
  ASTContext *in_stack_fffffffffffff240;
  undefined1 in_stack_fffffffffffff28f;
  AssertionPortSymbol *in_stack_fffffffffffff290;
  Type *in_stack_fffffffffffff298;
  AssertionPortSymbol *in_stack_fffffffffffff2a0;
  Type *in_stack_fffffffffffff2a8;
  undefined7 in_stack_fffffffffffff2b0;
  undefined1 in_stack_fffffffffffff2b7;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff2b8;
  Scope *local_bc8;
  Scope *local_bb8;
  Scope *local_ba8;
  bitmask<slang::ast::ASTFlags> local_b80;
  SourceLocation local_b78;
  SourceLocation SStack_b70;
  undefined4 local_b5c;
  bitmask<slang::ast::ASTFlags> local_b58;
  undefined8 local_b50;
  pointer local_b40;
  size_t local_b38;
  undefined8 local_b30;
  pointer local_b20;
  size_t sStack_b18;
  undefined1 local_b09;
  AssertionInstanceExpression *local_b08;
  SourceLocation local_b00;
  AssertionExpr *local_af8;
  SmallVectorBase<const_slang::ast::Symbol_*> local_af0 [2];
  SyntaxNode *local_ab0;
  bitmask<slang::ast::ASTFlags> local_aa8;
  bitmask<slang::ast::ASTFlags> local_aa0;
  bitmask<slang::ast::ASTFlags> local_a98;
  bitmask<slang::ast::ASTFlags> local_a90;
  bitmask<slang::ast::ASTFlags> local_a88;
  bitmask<slang::ast::ASTFlags> local_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  bitmask<slang::ast::ASTFlags> abStack_a50 [4];
  Symbol **local_a30;
  size_t local_a28;
  char *pcStack_a20;
  string_view local_a10;
  SourceLocation local_a00;
  undefined4 local_9f4;
  Diagnostic *local_9f0;
  reference local_9e8;
  iterator local_9e0;
  iterator local_9d0;
  undefined1 *local_9c0;
  size_t local_9b8;
  char *pcStack_9b0;
  SourceLocation local_9a8;
  SourceLocation SStack_9a0;
  undefined4 local_98c;
  SourceLocation local_988;
  undefined4 local_980;
  undefined4 local_97c;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_950;
  Expression local_938;
  size_t local_8f8;
  char *pcStack_8f0;
  SourceLocation local_8e8;
  SourceLocation SStack_8e0;
  undefined4 local_8cc;
  size_t local_8c8;
  char *pcStack_8c0;
  SourceLocation local_8b8;
  SourceLocation SStack_8b0;
  undefined4 local_8a4;
  Diagnostic *local_8a0;
  size_t local_898;
  char *pcStack_890;
  SourceRange local_880;
  undefined4 local_86c;
  iterator local_868;
  AssertionPortSymbol *local_858;
  Type *local_850;
  Token local_848;
  SourceLocation local_838;
  undefined4 local_82c;
  size_t local_828;
  char *pcStack_820;
  SourceLocation local_810;
  undefined4 local_804;
  Diagnostic *local_800;
  iterator local_7f8;
  char_pointer local_7e8;
  table_element_pointer local_7e0;
  size_t local_7d8;
  char *pcStack_7d0;
  SourceRange local_7c0;
  undefined4 local_7ac;
  SyntaxNode *local_7a8;
  PropertyExprSyntax **local_7a0;
  AssertionPortSymbol **local_798;
  undefined1 *local_790;
  Scope **local_788;
  Symbol **local_780;
  undefined8 **local_778;
  undefined1 local_770 [64];
  PropertyExprSyntax *local_730;
  undefined8 *local_728;
  AssertionPortSymbol *local_720;
  AssertionPortSymbol **local_718;
  __normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
  local_710;
  pointer *local_708;
  SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
  local_700 [2];
  SourceLocation local_688;
  uint local_680;
  byte local_67a;
  undefined1 local_679;
  undefined8 local_678;
  InvalidAssertionExpr *local_670;
  size_t local_668;
  char *pcStack_660;
  SourceLocation local_658;
  SourceLocation SStack_650;
  undefined4 local_63c;
  size_t local_638;
  char *pcStack_630;
  SourceLocation local_628;
  SourceLocation SStack_620;
  undefined4 local_60c;
  TempVarSymbol *local_608;
  SourceLocation local_600;
  Symbol *local_5f8;
  undefined8 *local_5f0;
  SourceLocation local_5e8;
  undefined1 local_5e0 [112];
  byte local_570;
  undefined8 local_568;
  undefined8 uStack_560;
  ASTContext local_558;
  undefined1 local_518 [264];
  undefined1 local_410 [16];
  size_t local_400;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> local_3d0 [2];
  LetDeclSymbol *local_390;
  PropertySymbol *local_388;
  SequenceSymbol *local_380;
  pointer local_378;
  size_t local_370;
  Scope *local_368;
  Type *local_360;
  Compilation *local_358;
  undefined8 *local_350;
  long local_348;
  Symbol *local_340;
  SourceRange local_338;
  AssertionInstanceExpression *local_328;
  string_view *local_320;
  undefined1 *local_318;
  AssertionPortSymbol *local_310;
  Type *local_308;
  string_view *local_300;
  undefined1 *local_2f8;
  char_pointer local_2f0;
  table_element_pointer local_2e8;
  Expression *local_2e0;
  AssertionPortSymbol **local_2d8;
  undefined1 *local_2d0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
  local_2c8;
  string_view *local_2b0;
  undefined1 *local_2a8;
  iterator local_2a0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
  local_290;
  string_view *local_278;
  undefined1 *local_270;
  iterator local_268;
  size_t local_258;
  string_view *local_250;
  undefined1 *local_248;
  size_t local_240;
  string_view *local_238;
  undefined1 *local_230;
  uint local_224;
  value_type *local_220;
  value_type *local_218;
  uint local_20c;
  group_type *local_208;
  size_t local_200;
  pow2_quadratic_prober local_1f8;
  size_t local_1e8;
  size_t local_1e0;
  string_view *local_1d8;
  undefined1 *local_1d0;
  uint local_1c4;
  value_type *local_1c0;
  value_type *local_1b8;
  uint local_1ac;
  group_type *local_1a8;
  size_t local_1a0;
  pow2_quadratic_prober local_198;
  size_t local_188;
  size_t local_180;
  string_view *local_178;
  undefined1 *local_170;
  undefined1 local_151 [17];
  Expression *local_140;
  AssertionPortSymbol **local_138;
  undefined1 *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
  local_b0;
  size_t local_98;
  size_t local_90;
  Symbol **local_88;
  Expression *local_80;
  key_type *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Symbol **local_10;
  undefined1 *local_8;
  undefined4 extraout_var_00;
  
  local_350 = in_R8;
  local_348 = in_RSI;
  local_340 = in_RDI;
  local_338.startLoc = in_RDX;
  local_338.endLoc = in_RCX;
  local_358 = ASTContext::getCompilation((ASTContext *)0xb927bc);
  std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *)0xb927d1)
  ;
  Compilation::noteReference
            ((Compilation *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (Symbol *)in_stack_fffffffffffff0e8,(bool)in_stack_fffffffffffff0e7);
  if (local_340->kind == Sequence) {
    local_380 = Symbol::as<slang::ast::SequenceSymbol>((Symbol *)0xb92824);
    local_360 = Compilation::getType(in_stack_fffffffffffff130,in_stack_fffffffffffff12c);
    local_378 = (local_380->ports)._M_ptr;
    local_370 = (local_380->ports)._M_extent._M_extent_value;
    local_ba8 = (Scope *)0x0;
    if (local_380 != (SequenceSymbol *)0x0) {
      local_ba8 = &local_380->super_Scope;
    }
    local_368 = local_ba8;
  }
  else if (local_340->kind == Property) {
    local_388 = Symbol::as<slang::ast::PropertySymbol>((Symbol *)0xb928bf);
    local_360 = Compilation::getType(in_stack_fffffffffffff130,in_stack_fffffffffffff12c);
    local_378 = (local_388->ports)._M_ptr;
    local_370 = (local_388->ports)._M_extent._M_extent_value;
    local_bb8 = (Scope *)0x0;
    if (local_388 != (PropertySymbol *)0x0) {
      local_bb8 = &local_388->super_Scope;
    }
    local_368 = local_bb8;
  }
  else {
    local_390 = Symbol::as<slang::ast::LetDeclSymbol>((Symbol *)0xb9295a);
    local_360 = Compilation::getVoidType(local_358);
    local_378 = (local_390->ports)._M_ptr;
    local_370 = (local_390->ports)._M_extent._M_extent_value;
    local_bc8 = (Scope *)0x0;
    if (local_390 != (LetDeclSymbol *)0x0) {
      local_bc8 = &local_390->super_Scope;
    }
    local_368 = local_bc8;
  }
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0xb929ed);
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
              *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0));
  if (((local_348 != 0) && (*(long *)(local_348 + 0x58) != 0)) &&
     (bVar2 = Expression::collectArgs
                        (in_stack_fffffffffffff240,in_stack_fffffffffffff238,
                         in_stack_fffffffffffff230,in_stack_fffffffffffff228), !bVar2)) {
    local_328 = (AssertionInstanceExpression *)
                Expression::badExpr((Compilation *)
                                    CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                                    in_stack_fffffffffffff0d8);
    local_558.assertionInstance._0_4_ = 1;
    goto LAB_00b94e9b;
  }
  local_558.firstTempVar = (TempVarSymbol *)local_350[6];
  local_568 = *local_350;
  uStack_560 = local_350[1];
  local_558.scope.ptr = (Scope *)local_350[2];
  local_558._8_8_ = local_350[3];
  local_558.flags.m_bits = local_350[4];
  local_558.instanceOrProc = (Symbol *)local_350[5];
  ASTContext::tryFillAssertionDetails((ASTContext *)in_stack_fffffffffffff0f8);
  AssertionInstanceDetails::AssertionInstanceDetails
            ((AssertionInstanceDetails *)
             CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
  local_5f8 = local_340;
  local_5f0 = &local_568;
  local_600 = SourceRange::start(&local_338);
  local_608 = local_558.firstTempVar;
  while (local_5e8 = local_600, local_608 != (TempVarSymbol *)0x0) {
    if (*(Symbol **)&(local_608->super_VariableSymbol).super_ValueSymbol.super_Symbol == local_340)
    {
      DVar17 = SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0);
      if (local_340->kind == Sequence) {
        local_60c = 0x900007;
        local_628 = local_338.startLoc;
        SStack_620 = local_338.endLoc;
        SVar12.startLoc._4_2_ = in_stack_fffffffffffff104.subsystem;
        SVar12.startLoc._6_2_ = in_stack_fffffffffffff104.code;
        SVar12.startLoc._0_4_ = in_stack_fffffffffffff100;
        SVar12.endLoc = in_stack_fffffffffffff108;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff0f8,DVar17,SVar12);
        local_638 = (local_340->name)._M_len;
        pcStack_630 = (local_340->name)._M_str;
        arg_00._M_len._4_4_ = in_stack_fffffffffffff12c;
        arg_00._M_len._0_4_ = in_stack_fffffffffffff128;
        arg_00._M_str = (char *)in_stack_fffffffffffff130;
        Diagnostic::operator<<(in_stack_fffffffffffff120,arg_00);
        local_328 = (AssertionInstanceExpression *)
                    Expression::badExpr((Compilation *)
                                        CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0
                                                ),in_stack_fffffffffffff0d8);
        local_558.assertionInstance._0_4_ = 1;
        goto LAB_00b94e7d;
      }
      if (local_340->kind == LetDecl) {
        local_63c = 0x8c0007;
        local_658 = local_338.startLoc;
        SStack_650 = local_338.endLoc;
        sourceRange.startLoc._4_2_ = in_stack_fffffffffffff104.subsystem;
        sourceRange.startLoc._6_2_ = in_stack_fffffffffffff104.code;
        sourceRange.startLoc._0_4_ = in_stack_fffffffffffff100;
        sourceRange.endLoc = in_stack_fffffffffffff108;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff0f8,DVar17,sourceRange);
        local_668 = (local_340->name)._M_len;
        pcStack_660 = (local_340->name)._M_str;
        arg_01._M_len._4_4_ = in_stack_fffffffffffff12c;
        arg_01._M_len._0_4_ = in_stack_fffffffffffff128;
        arg_01._M_str = (char *)in_stack_fffffffffffff130;
        Diagnostic::operator<<(in_stack_fffffffffffff120,arg_01);
        local_328 = (AssertionInstanceExpression *)
                    Expression::badExpr((Compilation *)
                                        CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0
                                                ),in_stack_fffffffffffff0d8);
        local_558.assertionInstance._0_4_ = 1;
        goto LAB_00b94e7d;
      }
      if ((undefined1  [192])
          ((undefined1  [192])(local_608->super_VariableSymbol).super_ValueSymbol.driverMap.field_0
          & (undefined1  [192])0x1) != (undefined1  [192])0x0) {
        local_678 = 0;
        local_670 = BumpAllocator::emplace<slang::ast::InvalidAssertionExpr,decltype(nullptr)>
                              ((BumpAllocator *)
                               CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                               (void **)in_stack_fffffffffffff0d8);
        local_679 = 1;
        local_328 = BumpAllocator::
                    emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::InvalidAssertionExpr&,bool,slang::SourceRange&>
                              ((BumpAllocator *)in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                               in_stack_fffffffffffff110,
                               (InvalidAssertionExpr *)in_stack_fffffffffffff108,
                               (bool *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100)
                               ,(SourceRange *)in_stack_fffffffffffff0f8);
        local_558.assertionInstance._0_4_ = 1;
        goto LAB_00b94e7d;
      }
      local_570 = 1;
    }
    if ((local_608->super_VariableSymbol).super_ValueSymbol.driverMap.field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
        .first[0].left == 0) {
      local_608 = *(TempVarSymbol **)
                   ((local_608->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len +
                   0x30);
    }
    else {
      local_608 = (TempVarSymbol *)
                  (local_608->super_VariableSymbol).super_ValueSymbol.driverMap.field_0.rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                  .first[0].left;
    }
  }
  local_67a = 0;
  local_680 = 0;
  SourceLocation::SourceLocation(&local_688);
  SmallVector<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_4UL>
  ::SmallVector((SmallVector<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_4UL>
                 *)0xb92e97);
  local_708 = &local_378;
  local_710._M_current =
       (AssertionPortSymbol **)
       std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffff0d8);
  local_718 = (AssertionPortSymbol **)
              std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::end
                        ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>
                          *)in_stack_fffffffffffff0e8);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                       (__normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff0d8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppAVar6 = __gnu_cxx::
              __normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_710);
    local_720 = *ppAVar6;
    local_728 = &local_568;
    local_730 = (PropertyExprSyntax *)0x0;
    std::optional<slang::ast::ASTContext>::optional((optional<slang::ast::ASTContext> *)0xb92f32);
    local_7a0 = &local_730;
    local_798 = &local_720;
    local_790 = local_770;
    local_788 = &local_368;
    local_780 = &local_5f8;
    local_778 = &local_728;
    uVar7 = (ulong)local_680;
    sVar10 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::size(local_3d0);
    if (uVar7 < sVar10) {
      uVar7 = (ulong)local_680;
      local_680 = local_680 + 1;
      ppSVar8 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::operator[](local_3d0,uVar7);
      local_7a8 = *ppSVar8;
      if (local_7a8->kind == EmptyArgument) {
        fromLookup::anon_class_48_6_f5681a60::operator()
                  ((anon_class_48_6_f5681a60 *)in_stack_fffffffffffff120);
        if (local_730 == (PropertyExprSyntax *)0x0) {
          bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            (&(local_720->super_Symbol).name);
          if (!bVar2) {
            local_7ac = 7;
            SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff130)
            ;
            sourceRange_00.startLoc._4_2_ = in_stack_fffffffffffff104.subsystem;
            sourceRange_00.startLoc._6_2_ = in_stack_fffffffffffff104.code;
            sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffff100;
            sourceRange_00.endLoc = in_stack_fffffffffffff108;
            local_7c0 = SVar12;
            ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff0f8,
                                SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),sourceRange_00);
            local_7d8 = (local_720->super_Symbol).name._M_len;
            pcStack_7d0 = (local_720->super_Symbol).name._M_str;
            arg_02._M_len._4_4_ = in_stack_fffffffffffff12c;
            arg_02._M_len._0_4_ = in_stack_fffffffffffff128;
            arg_02._M_str = (char *)in_stack_fffffffffffff130;
            Diagnostic::operator<<(in_stack_fffffffffffff120,arg_02);
          }
        }
      }
      else {
        local_730 = slang::syntax::SyntaxNode::as<slang::syntax::PropertyExprSyntax>(local_7a8);
      }
      local_300 = &(local_720->super_Symbol).name;
      local_2f8 = local_410;
      local_2b0 = local_300;
      local_2a8 = local_410;
      local_238 = local_300;
      local_230 = local_410;
      local_240 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
                  ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                              *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff0d8);
      psVar1 = local_238;
      local_1e0 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                  *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                                 (size_t)in_stack_fffffffffffff0d8);
      local_1d8 = psVar1;
      local_1e8 = local_240;
      local_1d0 = local_410;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_1f8,local_1e0);
      do {
        local_200 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_1f8);
        local_208 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                    ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                              *)0xb932af);
        local_208 = local_208 + local_200;
        local_20c = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff0e8,
                               CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
        if (local_20c != 0) {
          local_218 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                      ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                  *)0xb93311);
          local_220 = local_218 + local_200 * 0xf;
          do {
            local_224 = boost::unordered::detail::foa::unchecked_countr_zero(0);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
            ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                    *)0xb93364);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
            ::
            key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>>
                      ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                        *)0xb93397);
            bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff0f8,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0));
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
              ::table_locator(&local_2c8,local_208,local_224,
                              (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                               *)(local_220 + local_224));
              goto LAB_00b934b3;
            }
            local_20c = local_20c - 1 & local_20c;
          } while (local_20c != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                           (size_t)in_stack_fffffffffffff0d8);
        if (bVar2) {
          memset(&local_2c8,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
          ::table_locator(&local_2c8);
          goto LAB_00b934b3;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_1f8,local_400);
      } while (bVar2);
      memset(&local_2c8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
      ::table_locator(&local_2c8);
LAB_00b934b3:
      local_2a0 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::make_iterator((locator *)0xb934c4);
      local_2f0 = local_2a0.pc_;
      local_2e8 = local_2a0.p_;
      local_7e8 = local_2a0.pc_;
      local_7e0 = local_2a0.p_;
      local_7f8 = boost::unordered::
                  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                         *)0xb93561);
      bVar2 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffff0d8);
      if (bVar2) {
        local_804 = 0x4a0007;
        ppVar9 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
        local_810 = parsing::Token::location(&((ppVar9->second).first)->name);
        local_800 = ASTContext::addDiag((ASTContext *)
                                        CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0
                                                ),in_stack_fffffffffffff104,
                                        in_stack_fffffffffffff0f8);
        local_828 = (local_720->super_Symbol).name._M_len;
        pcStack_820 = (local_720->super_Symbol).name._M_str;
        arg_03._M_len._4_4_ = in_stack_fffffffffffff12c;
        arg_03._M_len._0_4_ = in_stack_fffffffffffff128;
        arg_03._M_str = (char *)in_stack_fffffffffffff130;
        Diagnostic::operator<<(in_stack_fffffffffffff120,arg_03);
        local_82c = 0xc0001;
        TVar13 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffff110);
        local_848 = TVar13;
        local_838 = parsing::Token::location(&local_848);
        Diagnostic::addNote((Diagnostic *)
                            CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                            in_stack_fffffffffffff0f4,in_stack_fffffffffffff0e8);
        ppVar9 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
        (ppVar9->second).second = true;
        local_67a = 1;
      }
    }
    else {
      local_320 = &(local_720->super_Symbol).name;
      local_318 = local_410;
      local_278 = local_320;
      local_270 = local_410;
      local_250 = local_320;
      local_248 = local_410;
      local_258 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
                  ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                              *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff0d8);
      psVar1 = local_250;
      local_180 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                  *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                                 (size_t)in_stack_fffffffffffff0d8);
      local_178 = psVar1;
      local_188 = local_258;
      local_170 = local_410;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_198,local_180);
      do {
        local_1a0 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_198);
        local_1a8 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                    ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                              *)0xb93859);
        local_1a8 = local_1a8 + local_1a0;
        local_1ac = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff0e8,
                               CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
        if (local_1ac != 0) {
          local_1b8 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                      ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                  *)0xb938bb);
          local_1c0 = local_1b8 + local_1a0 * 0xf;
          do {
            local_1c4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffff2b8.m_bits =
                 (underlying_type)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                         *)0xb9390e);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
            ::
            key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>>
                      ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                        *)0xb93941);
            bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff0f8,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0));
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
              ::table_locator(&local_290,local_1a8,local_1c4,
                              (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                               *)(local_1c0 + local_1c4));
              goto LAB_00b93a5d;
            }
            local_1ac = local_1ac - 1 & local_1ac;
          } while (local_1ac != 0);
        }
        in_stack_fffffffffffff2b7 =
             boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                               CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                               (size_t)in_stack_fffffffffffff0d8);
        if ((bool)in_stack_fffffffffffff2b7) {
          memset(&local_290,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
          ::table_locator(&local_290);
          goto LAB_00b93a5d;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_198,local_400);
      } while (bVar2);
      memset(&local_290,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
      ::table_locator(&local_290);
LAB_00b93a5d:
      local_268 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::make_iterator((locator *)0xb93a6e);
      local_310 = (AssertionPortSymbol *)local_268.pc_;
      local_308 = (Type *)local_268.p_;
      local_858 = (AssertionPortSymbol *)local_268.pc_;
      local_850 = (Type *)local_268.p_;
      in_stack_fffffffffffff290 = (AssertionPortSymbol *)local_268.pc_;
      in_stack_fffffffffffff298 = (Type *)local_268.p_;
      in_stack_fffffffffffff2a0 = (AssertionPortSymbol *)local_268.pc_;
      in_stack_fffffffffffff2a8 = (Type *)local_268.p_;
      local_868 = boost::unordered::
                  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                         *)0xb93b0b);
      in_stack_fffffffffffff28f =
           boost::unordered::detail::foa::operator!=
                     ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                       *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                      (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                       *)in_stack_fffffffffffff0d8);
      if ((bool)in_stack_fffffffffffff28f) {
        ppVar9 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
        (ppVar9->second).second = true;
        ppVar9 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
        local_730 = (PropertyExprSyntax *)((ppVar9->second).first)->expr;
        if (local_730 == (PropertyExprSyntax *)0x0) {
          fromLookup::anon_class_48_6_f5681a60::operator()
                    ((anon_class_48_6_f5681a60 *)in_stack_fffffffffffff120);
          if (local_730 == (PropertyExprSyntax *)0x0) {
            bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                              (&(local_720->super_Symbol).name);
            if (!bVar2) {
              local_86c = 7;
              boost::unordered::detail::foa::
              table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
              ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
              SVar12 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)in_stack_fffffffffffff130);
              sourceRange_01.startLoc._4_2_ = in_stack_fffffffffffff104.subsystem;
              sourceRange_01.startLoc._6_2_ = in_stack_fffffffffffff104.code;
              sourceRange_01.startLoc._0_4_ = in_stack_fffffffffffff100;
              sourceRange_01.endLoc = in_stack_fffffffffffff108;
              local_880 = SVar12;
              ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff0f8,
                                  SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),sourceRange_01);
              local_898 = (local_720->super_Symbol).name._M_len;
              pcStack_890 = (local_720->super_Symbol).name._M_str;
              arg_04._M_len._4_4_ = in_stack_fffffffffffff12c;
              arg_04._M_len._0_4_ = in_stack_fffffffffffff128;
              arg_04._M_str = (char *)in_stack_fffffffffffff130;
              Diagnostic::operator<<(in_stack_fffffffffffff120,arg_04);
            }
          }
        }
      }
      else {
        fromLookup::anon_class_48_6_f5681a60::operator()
                  ((anon_class_48_6_f5681a60 *)in_stack_fffffffffffff120);
        if (local_730 == (PropertyExprSyntax *)0x0) {
          bVar2 = boost::unordered::
                  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::empty((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                           *)0xb93cac);
          if (bVar2) {
            local_8a4 = 0x9f0007;
            local_8b8 = local_338.startLoc;
            SStack_8b0 = local_338.endLoc;
            sourceRange_02.startLoc._4_2_ = in_stack_fffffffffffff104.subsystem;
            sourceRange_02.startLoc._6_2_ = in_stack_fffffffffffff104.code;
            sourceRange_02.startLoc._0_4_ = in_stack_fffffffffffff100;
            sourceRange_02.endLoc = in_stack_fffffffffffff108;
            local_8a0 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff0f8,
                                            SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                                            sourceRange_02);
            local_8c8 = (local_340->name)._M_len;
            pcStack_8c0 = (local_340->name)._M_str;
            arg_05._M_len._4_4_ = in_stack_fffffffffffff12c;
            arg_05._M_len._0_4_ = in_stack_fffffffffffff128;
            arg_05._M_str = (char *)in_stack_fffffffffffff130;
            Diagnostic::operator<<(in_stack_fffffffffffff120,arg_05);
            std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *
                       )0xb93d5e);
            Diagnostic::operator<<<unsigned_long>
                      ((Diagnostic *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                       (unsigned_long)in_stack_fffffffffffff0e8);
            SmallVectorBase<const_slang::syntax::SyntaxNode_*>::size(local_3d0);
            Diagnostic::operator<<<unsigned_long>
                      ((Diagnostic *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                       (unsigned_long)in_stack_fffffffffffff0e8);
            local_67a = 1;
            break;
          }
          bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            (&(local_720->super_Symbol).name);
          if (!bVar2) {
            local_8cc = 0xa20007;
            local_8e8 = local_338.startLoc;
            SStack_8e0 = local_338.endLoc;
            sourceRange_03.startLoc._4_2_ = in_stack_fffffffffffff104.subsystem;
            sourceRange_03.startLoc._6_2_ = in_stack_fffffffffffff104.code;
            sourceRange_03.startLoc._0_4_ = in_stack_fffffffffffff100;
            sourceRange_03.endLoc = in_stack_fffffffffffff108;
            ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff0f8,
                                SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),sourceRange_03);
            local_8f8 = (local_720->super_Symbol).name._M_len;
            pcStack_8f0 = (local_720->super_Symbol).name._M_str;
            arg_06._M_len._4_4_ = in_stack_fffffffffffff12c;
            arg_06._M_len._0_4_ = in_stack_fffffffffffff128;
            arg_06._M_str = (char *)in_stack_fffffffffffff130;
            Diagnostic::operator<<(in_stack_fffffffffffff120,arg_06);
          }
        }
      }
    }
    if (local_730 == (PropertyExprSyntax *)0x0) {
      local_67a = 1;
    }
    else {
      puVar18 = local_5e0;
      std::make_tuple<slang::syntax::PropertyExprSyntax_const*&,slang::ast::ASTContext_const&>
                ((PropertyExprSyntax **)in_stack_fffffffffffff0e8,
                 (ASTContext *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
      local_2d8 = &local_720;
      local_2e0 = &local_938;
      local_2d0 = puVar18;
      local_140 = local_2e0;
      local_138 = local_2d8;
      local_130 = puVar18;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
      ::al((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            *)0xb93efb);
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
      ::alloc_cted_or_fwded_key_type
                ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                  *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                 (allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
                  *)in_stack_fffffffffffff0d8,(AssertionPortSymbol **)0xb93f13);
      local_78 = boost::unordered::detail::foa::
                 alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                 ::move_or_fwd((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                                *)0xb93f22);
      local_70 = local_151;
      local_80 = local_140;
      local_68 = puVar18;
      local_88 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                 ::
                 key_from<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                           (local_78,local_140);
      local_90 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                 ::hash_for<slang::ast::Symbol_const*>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                            (Symbol **)in_stack_fffffffffffff0d8);
      local_98 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                                (size_t)in_stack_fffffffffffff0d8);
      local_10 = local_88;
      local_20 = local_90;
      puVar19 = puVar18;
      local_18 = local_98;
      local_8 = puVar18;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_98);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                             *)0xb9407e);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff0e8,
                              CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                     ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                 *)0xb940dc);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            this = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                           *)0xb9412f);
            __x = local_10;
            __y = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                  ::
                  key_from<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
                            ((pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
                              *)0xb94163);
            bVar2 = std::equal_to<const_slang::ast::Symbol_*>::operator()(this,__x,__y);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_00b9427f;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                           (size_t)in_stack_fffffffffffff0d8);
        if (bVar2) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
          ::table_locator(&local_b0);
          goto LAB_00b9427f;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,*(size_t *)(puVar18 + 8));
      } while (bVar2);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
      ::table_locator(&local_b0);
LAB_00b9427f:
      bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_b0);
      if (bVar2) {
        local_c0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::make_iterator((locator *)0xb942a1);
        local_c1 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_950,&local_c0,&local_c1);
      }
      else if (*(ulong *)(puVar19 + 0x28) < *(ulong *)(puVar19 + 0x20)) {
        in_stack_fffffffffffff0d8 = local_80;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    *)in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108,
                   CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                   (try_emplace_args_t *)in_stack_fffffffffffff0f8,
                   (Symbol **)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                   (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   in_stack_fffffffffffff120);
        local_d8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::make_iterator((locator *)0xb94343);
        local_f1[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_950,&local_d8,local_f1);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                  (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                   in_stack_fffffffffffff158,in_stack_fffffffffffff150);
        local_108 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    ::make_iterator((locator *)0xb943be);
        local_121[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_950,&local_108,local_121);
      }
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
      ::~alloc_cted_or_fwded_key_type
                ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                  *)0xb94446);
      std::
      variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      ::variant((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                 *)0xb9445d);
      bVar2 = checkAssertionArg((PropertyExprSyntax *)in_stack_fffffffffffff2a8,
                                in_stack_fffffffffffff2a0,(ASTContext *)in_stack_fffffffffffff298,
                                (ActualArg *)in_stack_fffffffffffff290,
                                (bool)in_stack_fffffffffffff28f);
      if (bVar2) {
        std::
        tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
        ::
        tuple<const_slang::ast::AssertionPortSymbol_*&,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_&,_true>
                  ((tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                    *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                   (AssertionPortSymbol **)in_stack_fffffffffffff0d8,
                   (variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    *)0xb944d4);
        SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
        ::push_back((SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                     *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                    (tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                     *)in_stack_fffffffffffff0d8);
      }
      else {
        local_67a = 1;
      }
      bVar2 = SourceLocation::operator_cast_to_bool((SourceLocation *)0xb944fa);
      local_e22 = false;
      if (!bVar2) {
        local_97c = 2;
        _Var3 = std::operator==((optional<slang::ast::ArgumentDirection> *)
                                CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                                &in_stack_fffffffffffff0d8->kind);
        local_e24 = true;
        if (!_Var3) {
          local_980 = 1;
          local_e24 = std::operator==((optional<slang::ast::ArgumentDirection> *)
                                      CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                                      &in_stack_fffffffffffff0d8->kind);
        }
        local_e22 = local_e24;
      }
      if (local_e22 != false) {
        local_688 = (local_720->super_Symbol).location;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_710);
  }
  uVar7 = (ulong)local_680;
  sVar10 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::size(local_3d0);
  if (uVar7 < sVar10) {
    local_98c = 0xa00007;
    local_9a8 = local_338.startLoc;
    SStack_9a0 = local_338.endLoc;
    sourceRange_04.startLoc._4_2_ = in_stack_fffffffffffff104.subsystem;
    sourceRange_04.startLoc._6_2_ = in_stack_fffffffffffff104.code;
    sourceRange_04.startLoc._0_4_ = in_stack_fffffffffffff100;
    sourceRange_04.endLoc = in_stack_fffffffffffff108;
    local_988 = (SourceLocation)
                ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff0f8,
                                    SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),sourceRange_04
                                   );
    local_9b8 = (local_340->name)._M_len;
    pcStack_9b0 = (local_340->name)._M_str;
    arg_07._M_len._4_4_ = in_stack_fffffffffffff12c;
    arg_07._M_len._0_4_ = in_stack_fffffffffffff128;
    arg_07._M_str = (char *)in_stack_fffffffffffff130;
    Diagnostic::operator<<(in_stack_fffffffffffff120,arg_07);
    std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::size
              ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *)
               0xb946c1);
    Diagnostic::operator<<<unsigned_long>
              ((Diagnostic *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
               (unsigned_long)in_stack_fffffffffffff0e8);
    in_stack_fffffffffffff1b8 = local_988;
    SmallVectorBase<const_slang::syntax::SyntaxNode_*>::size(local_3d0);
    Diagnostic::operator<<<unsigned_long>
              ((Diagnostic *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
               (unsigned_long)in_stack_fffffffffffff0e8);
    local_67a = 1;
  }
  local_9c0 = local_518;
  local_9d0 = boost::unordered::
              unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
              ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                       *)0xb9472e);
  local_9e0 = boost::unordered::
              unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
              ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                     *)0xb94752);
  sVar14._M_str = in_stack_fffffffffffff190;
  sVar14._M_len = in_stack_fffffffffffff198;
  while( true ) {
    uVar4 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff0d8);
    if (!(bool)uVar4) break;
    local_9e8 = boost::unordered::detail::foa::
                table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)0xb9479d);
    if (((local_9e8->second).second & 1U) == 0) {
      local_9f4 = 0x10007;
      in_stack_fffffffffffff1a8 = parsing::Token::location(&((local_9e8->second).first)->name);
      local_a00 = in_stack_fffffffffffff1a8;
      in_stack_fffffffffffff1a0 =
           ASTContext::addDiag((ASTContext *)
                               CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                               in_stack_fffffffffffff104,in_stack_fffffffffffff0f8);
      local_9f0 = in_stack_fffffffffffff1a0;
      sVar14 = parsing::Token::valueText
                         ((Token *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0));
      arg_08._M_len._4_4_ = in_stack_fffffffffffff12c;
      arg_08._M_len._0_4_ = in_stack_fffffffffffff128;
      arg_08._M_str = (char *)in_stack_fffffffffffff130;
      local_a10 = sVar14;
      Diagnostic::operator<<(in_stack_fffffffffffff120,arg_08);
      local_a28 = (local_340->name)._M_len;
      pcStack_a20 = (local_340->name)._M_str;
      arg_09._M_len._4_4_ = in_stack_fffffffffffff12c;
      arg_09._M_len._0_4_ = in_stack_fffffffffffff128;
      arg_09._M_str = (char *)in_stack_fffffffffffff130;
      Diagnostic::operator<<(in_stack_fffffffffffff120,arg_09);
      local_67a = 1;
    }
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                  *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
  }
  local_a78 = LookupLocation::max;
  uStack_a70 = DAT_00fffd90;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_a80,None);
  lookupLocation.index = in_stack_fffffffffffff100;
  lookupLocation.scope = (Scope *)in_stack_fffffffffffff0f8;
  lookupLocation._12_2_ = in_stack_fffffffffffff104.subsystem;
  lookupLocation._14_2_ = in_stack_fffffffffffff104.code;
  flags.m_bits._4_4_ = in_stack_fffffffffffff0f4;
  flags.m_bits._0_4_ = in_stack_fffffffffffff0f0;
  ASTContext::ASTContext
            ((ASTContext *)in_stack_fffffffffffff0e8,
             (Scope *)CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),lookupLocation,
             flags);
  local_a30 = &local_5f8;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_a88,PropertyTimeAdvance);
  bVar2 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)
                     CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                     (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffff0e8);
  if (bVar2) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_a90,PropertyTimeAdvance);
    bitmask<slang::ast::ASTFlags>::operator|=(abStack_a50,&local_a90);
  }
  bitmask<slang::ast::ASTFlags>::bitmask(&local_a98,PropertyNegation);
  bVar2 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)
                     CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                     (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffff0e8);
  if (bVar2) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_aa0,PropertyNegation);
    bitmask<slang::ast::ASTFlags>::operator|=(abStack_a50,&local_aa0);
  }
  if (local_340->kind == LetDecl) {
    Symbol::as<slang::ast::LetDeclSymbol>((Symbol *)0xb94a63);
    not_null<const_slang::syntax::ExpressionSyntax_*>::operator*
              ((not_null<const_slang::syntax::ExpressionSyntax_*> *)0xb94a81);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_aa8,None);
    local_328 = (AssertionInstanceExpression *)
                Expression::create((Compilation *)
                                   CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0),
                                   (ExpressionSyntax *)in_stack_fffffffffffff2a8,
                                   (ASTContext *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff2b8
                                   ,in_stack_fffffffffffff298);
    local_558.assertionInstance._0_4_ = 1;
  }
  else {
    local_ab0 = Symbol::getSyntax(local_340);
    SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0xb94b26);
    local_b00 = local_688;
    local_af8 = bindAssertionBody((Symbol *)CONCAT17(uVar4,in_stack_fffffffffffff1b0),
                                  (SyntaxNode *)in_stack_fffffffffffff1a8,
                                  (ASTContext *)in_stack_fffffffffffff1a0,in_stack_fffffffffffff1b8,
                                  (AssertionInstanceDetails *)sVar14._M_len,
                                  (SmallVectorBase<const_slang::ast::Symbol_*> *)sVar14._M_str);
    local_b09 = 0;
    local_b08 = BumpAllocator::
                emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                          ((BumpAllocator *)in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                           in_stack_fffffffffffff110,(AssertionExpr *)in_stack_fffffffffffff108,
                           (bool *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                           (SourceRange *)in_stack_fffffffffffff0f8);
    iVar5 = SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
            ::copy(local_700,(EVP_PKEY_CTX *)local_358,src);
    local_b30 = CONCAT44(extraout_var,iVar5);
    std::
    span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
    ::
    span<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
              ((span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
                *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
               (span<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
                *)in_stack_fffffffffffff0e8);
    (local_b08->arguments)._M_ptr = local_b20;
    (local_b08->arguments)._M_extent._M_extent_value = sStack_b18;
    iVar5 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                      (local_af0,(EVP_PKEY_CTX *)local_358,src_00);
    uVar11 = CONCAT44(extraout_var_00,iVar5);
    SVar16 = extraout_RDX;
    local_b50 = uVar11;
    std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::
    span<const_slang::ast::Symbol_*,_18446744073709551615UL>
              ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
               (span<const_slang::ast::Symbol_*,_18446744073709551615UL> *)in_stack_fffffffffffff0e8
              );
    DVar17 = SUB84((ulong)uVar11 >> 0x20,0);
    (local_b08->localVars)._M_ptr = local_b40;
    (local_b08->localVars)._M_extent._M_extent_value = local_b38;
    if ((local_570 & 1) != 0) {
      SVar15 = (SourceLocation)&local_558;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_b58,PropertyTimeAdvance);
      bVar2 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)
                         CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffff0e8);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        this_00 = &local_558;
        bitmask<slang::ast::ASTFlags>::bitmask(&local_b80,PropertyNegation);
        bVar2 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)
                           CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffff0e8);
        if (bVar2) {
          sourceRange_06.endLoc = SVar16;
          sourceRange_06.startLoc = SVar15;
          ASTContext::addDiag(this_00,DVar17,sourceRange_06);
        }
      }
      else {
        local_b5c = 0x8f0007;
        local_b78 = local_338.startLoc;
        SStack_b70 = local_338.endLoc;
        sourceRange_05.endLoc = SVar16;
        sourceRange_05.startLoc = SVar15;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff0f8,DVar17,sourceRange_05);
      }
    }
    if ((local_67a & 1) == 0) {
      bVar2 = AssertionExpr::bad(local_af8);
      if (bVar2) goto LAB_00b94e01;
      local_328 = local_b08;
    }
    else {
LAB_00b94e01:
      local_328 = (AssertionInstanceExpression *)
                  Expression::badExpr((Compilation *)
                                      CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0),
                                      in_stack_fffffffffffff0d8);
    }
    local_558.assertionInstance._0_4_ = 1;
    SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0xb94e5f);
  }
  SmallVector<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_4UL>
  ::~SmallVector((SmallVector<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_4UL>
                  *)0xb94e6c);
LAB_00b94e7d:
  AssertionInstanceDetails::~AssertionInstanceDetails
            ((AssertionInstanceDetails *)
             CONCAT17(in_stack_fffffffffffff0e7,in_stack_fffffffffffff0e0));
LAB_00b94e9b:
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
               *)0xb94ea8);
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0xb94eb5);
  return &local_328->super_Expression;
}

Assistant:

Expression& AssertionInstanceExpression::fromLookup(const Symbol& symbol,
                                                    const InvocationExpressionSyntax* syntax,
                                                    SourceRange range,
                                                    const ASTContext& parentContext) {
    auto& comp = parentContext.getCompilation();
    const Type* type;
    const Scope* symbolScope;
    std::span<const AssertionPortSymbol* const> formalPorts;

    comp.noteReference(symbol);
    switch (symbol.kind) {
        case SymbolKind::Sequence: {
            auto& seq = symbol.as<SequenceSymbol>();
            type = &comp.getType(SyntaxKind::SequenceType);
            formalPorts = seq.ports;
            symbolScope = &seq;
            break;
        }
        case SymbolKind::Property: {
            auto& prop = symbol.as<PropertySymbol>();
            type = &comp.getType(SyntaxKind::PropertyType);
            formalPorts = prop.ports;
            symbolScope = &prop;
            break;
        }
        case SymbolKind::LetDecl: {
            auto& let = symbol.as<LetDeclSymbol>();
            type = &comp.getVoidType();
            formalPorts = let.ports;
            symbolScope = &let;
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }

    SmallVector<const SyntaxNode*> orderedArgs;
    NamedArgMap namedArgs;
    if (syntax && syntax->arguments) {
        if (!collectArgs(parentContext, *syntax->arguments, orderedArgs, namedArgs))
            return badExpr(comp, nullptr);
    }

    ASTContext context = parentContext;
    context.tryFillAssertionDetails();

    AssertionInstanceDetails instance;
    instance.symbol = &symbol;
    instance.prevContext = &context;
    instance.instanceLoc = range.start();

    // Check for recursive instantiation. This is illegal for sequences, and allowed in
    // some forms for properties.
    auto currInst = context.assertionInstance;
    while (currInst) {
        if (currInst->symbol == &symbol) {
            if (symbol.kind == SymbolKind::Sequence) {
                context.addDiag(diag::RecursiveSequence, range) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (symbol.kind == SymbolKind::LetDecl) {
                context.addDiag(diag::RecursiveLet, range) << symbol.name;
                return badExpr(comp, nullptr);
            }

            // Properties are allowed to be recursive, but we should avoid trying
            // to expand them because that will continue forever. Instead, we want
            // to expand one time for each unique invocation of the property and when
            // we encounter it again we should mark a placeholder and return to stop
            // the recursion.
            if (currInst->isRecursive) {
                auto& body = *comp.emplace<InvalidAssertionExpr>(nullptr);
                return *comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                                  /* isRecursiveProperty */ true,
                                                                  range);
            }
            instance.isRecursive = true;
        }

        if (currInst->argDetails)
            currInst = currInst->argDetails;
        else {
            SLANG_ASSERT(currInst->prevContext);
            currInst = currInst->prevContext->assertionInstance;
        }
    }

    // Now map all arguments to their formal ports.
    bool bad = false;
    uint32_t orderedIndex = 0;
    SourceLocation outputLocalVarArgLoc;
    SmallVector<std::tuple<const Symbol*, ActualArg>, 4> actualArgs;

    for (auto formal : formalPorts) {
        const ASTContext* argCtx = &context;
        const PropertyExprSyntax* expr = nullptr;
        std::optional<ASTContext> defValCtx;

        auto setDefault = [&] {
            expr = formal->defaultValueSyntax;
            defValCtx.emplace(*symbolScope, LookupLocation::after(*formal));
            defValCtx->assertionInstance = &instance;
            defValCtx->flags |= ASTFlags::AssertionDefaultArg;
            argCtx = &defValCtx.value();
        };

        if (orderedIndex < orderedArgs.size()) {
            auto arg = orderedArgs[orderedIndex++];
            if (arg->kind == SyntaxKind::EmptyArgument) {
                // Empty arguments are allowed as long as a default is provided.
                setDefault();
                if (!expr && !formal->name.empty())
                    context.addDiag(diag::ArgCannotBeEmpty, arg->sourceRange()) << formal->name;
            }
            else {
                expr = &arg->as<PropertyExprSyntax>();
            }

            // Make sure there isn't also a named value for this argument.
            if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
                auto& diag = context.addDiag(diag::DuplicateArgAssignment,
                                             it->second.first->name.location());
                diag << formal->name;
                diag.addNote(diag::NotePreviousUsage, arg->getFirstToken().location());
                it->second.second = true;
                bad = true;
            }
        }
        else if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
            // Mark this argument as used so that we can later detect if
            // any were unused.
            it->second.second = true;

            expr = it->second.first->expr;
            if (!expr) {
                // Empty arguments are allowed as long as a default is provided.
                setDefault();
                if (!expr && !formal->name.empty()) {
                    context.addDiag(diag::ArgCannotBeEmpty, it->second.first->sourceRange())
                        << formal->name;
                }
            }
        }
        else {
            setDefault();
            if (!expr) {
                if (namedArgs.empty()) {
                    auto& diag = context.addDiag(diag::TooFewArguments, range);
                    diag << symbol.name;
                    diag << formalPorts.size() << orderedArgs.size();
                    bad = true;
                    break;
                }
                else if (!formal->name.empty()) {
                    context.addDiag(diag::UnconnectedArg, range) << formal->name;
                }
            }
        }

        if (!expr) {
            bad = true;
            continue;
        }

        // Map the expression to the port symbol; this will be looked up later
        // when we encounter uses in the sequence / property body.
        instance.argumentMap.emplace(formal, std::make_tuple(expr, *argCtx));

        // Do type checking for all arguments now, even though the actuals will remain as
        // syntax nodes and be rebound when we actually encounter uses of them in the body.
        // This is because the arguments might not actually be used anywhere in the body,
        // so the only place to detect mismatches is here, but we can't save the bound
        // form because assertion item arguments are replaced as-is for each usage.
        ActualArg arg;
        if (!checkAssertionArg(*expr, *formal, *argCtx, arg, instance.isRecursive))
            bad = true;
        else
            actualArgs.push_back({formal, arg});

        if (!outputLocalVarArgLoc && (formal->direction == ArgumentDirection::InOut ||
                                      formal->direction == ArgumentDirection::Out)) {
            outputLocalVarArgLoc = formal->location;
        }
    }

    // Make sure there weren't too many ordered arguments provided.
    if (orderedIndex < orderedArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, range);
        diag << symbol.name;
        diag << formalPorts.size();
        diag << orderedArgs.size();
        bad = true;
    }

    for (auto& pair : namedArgs) {
        // We marked all the args that we used, so anything left over is an arg assignment
        // for a non-existent arg.
        if (!pair.second.second) {
            auto& diag = context.addDiag(diag::ArgDoesNotExist, pair.second.first->name.location());
            diag << pair.second.first->name.valueText();
            diag << symbol.name;
            bad = true;
        }
    }

    ASTContext bodyContext(*symbolScope, LookupLocation::max);
    bodyContext.assertionInstance = &instance;

    // Propagate previously determined time advance specs and negation operators
    if (context.flags.has(ASTFlags::PropertyTimeAdvance))
        bodyContext.flags |= ASTFlags::PropertyTimeAdvance;
    if (context.flags.has(ASTFlags::PropertyNegation))
        bodyContext.flags |= ASTFlags::PropertyNegation;

    // Let declarations expand directly to an expression.
    if (symbol.kind == SymbolKind::LetDecl)
        return create(comp, *symbol.as<LetDeclSymbol>().exprSyntax, bodyContext);

    // Now instantiate by creating the assertion expression of the sequence / property body.
    auto bodySyntax = symbol.getSyntax();
    SLANG_ASSERT(bodySyntax);

    SmallVector<const Symbol*> localVars;
    auto& body = bindAssertionBody(symbol, *bodySyntax, bodyContext, outputLocalVarArgLoc, instance,
                                   localVars);

    auto result = comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                            /* isRecursiveProperty */ false, range);
    result->arguments = actualArgs.copy(comp);
    result->localVars = localVars.copy(comp);

    if (instance.isRecursive) {
        if (!context.flags.has(ASTFlags::PropertyTimeAdvance))
            context.addDiag(diag::RecursivePropTimeAdvance, range);
        else if (context.flags.has(ASTFlags::PropertyNegation))
            context.addDiag(diag::RecursivePropNegation, range);
    }

    if (bad || body.bad())
        return badExpr(comp, result);

    return *result;
}